

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

QVariant * __thiscall
QGenericItemModel::headerData
          (QVariant *__return_storage_ptr__,QGenericItemModel *this,int section,
          Orientation orientation,int role)

{
  long in_FS_OFFSET;
  int role_local;
  Orientation orientation_local;
  int section_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  role_local = role;
  orientation_local = orientation;
  section_local = section;
  QGenericItemModelImplBase::callConst<QVariant,int,Qt::Orientation,int>
            (__return_storage_ptr__,*(QGenericItemModelImplBase **)(this + 0x10),HeaderData,
             &section_local,&orientation_local,&role_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::HeaderData,
                                     section, orientation, role);
}